

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pad-reflect-1d.cpp
# Opt level: O0

void test_pad_reflect_1d(bool use_gpu)

{
  void *pvVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ulong uVar5;
  size_t sVar6;
  undefined8 uVar7;
  byte in_DIL;
  ggml_cgraph *gf_1;
  ggml_tensor *out_4;
  float expected_4 [40];
  float input_data_1 [20];
  ggml_tensor *t_1;
  ggml_cgraph *gf;
  ggml_tensor *out_3;
  float expected_3 [7];
  ggml_tensor *out_2;
  float expected_2 [7];
  ggml_tensor *out_1;
  float expected_1 [6];
  float input_data [4];
  ggml_tensor *t;
  ggml_gallocr_t gallocr;
  ggml_tallocr tallocr;
  ggml_context *ctx;
  ggml_backend_buffer_t buffer;
  ggml_init_params params;
  ggml_backend_t backend;
  int ne2;
  int in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd04;
  float *in_stack_fffffffffffffd08;
  ggml_tensor *in_stack_fffffffffffffd10;
  undefined1 local_2a8 [160];
  undefined1 local_208 [96];
  int32_t local_1a8 [2];
  int32_t local_1a0 [2];
  int32_t local_198 [2];
  int32_t local_190 [2];
  int32_t local_188 [2];
  int32_t local_180 [4];
  ggml_tensor *local_170;
  ggml_tensor *local_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  ggml_tensor *local_158;
  ggml_tensor *local_150;
  ggml_tensor *local_148;
  ggml_tensor *local_140;
  ggml_tensor *local_138;
  undefined4 local_130;
  ggml_tensor *local_120;
  size_t local_118;
  void *local_110;
  char local_108 [24];
  char local_f0 [8];
  char local_e8 [32];
  void *local_c8;
  char local_c0 [8];
  long local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  byte local_1;
  
  local_1 = in_DIL & 1;
  local_10 = 0;
  fprintf(_stderr,"%s: using CPU backend\n","test_pad_reflect_1d");
  local_10 = ggml_backend_cpu_init();
  local_78 = 0x1000000;
  local_70 = 0;
  local_68 = 1;
  local_28 = 0x1000000;
  local_20 = 0;
  local_18 = CONCAT71(uStack_67,1);
  ggml_log_set(ggml_log_callback_default,0);
  uVar3 = local_18;
  local_90 = local_28;
  local_88 = local_20;
  local_80 = local_18;
  local_38 = ggml_init();
  local_30 = ggml_backend_alloc_buffer(local_10,0x1000000);
  ggml_tallocr_new(&local_b0,local_30);
  local_58 = local_b0;
  local_50 = local_a8;
  local_48 = local_a0;
  local_40 = local_98;
  uVar4 = ggml_backend_get_default_buffer_type(local_10);
  local_60 = ggml_gallocr_new(uVar4);
  local_b8 = ggml_new_tensor_1d(local_38,0,4);
  local_c8 = (void *)0x400000003f800000;
  local_c0[0] = '\0';
  local_c0[1] = '\0';
  local_c0[2] = '@';
  local_c0[3] = '@';
  local_c0[4] = '\0';
  local_c0[5] = '\0';
  local_c0[6] = -0x80;
  local_c0[7] = '@';
  ggml_tallocr_alloc(&local_58,local_b8);
  uVar5 = ggml_backend_is_cpu(local_10);
  lVar2 = local_b8;
  if ((uVar5 & 1) == 0) {
    uVar4 = ggml_nbytes(local_b8);
    ggml_backend_tensor_set(lVar2,&local_c8,0,uVar4);
  }
  else {
    pvVar1 = *(void **)(local_b8 + 0xf8);
    sVar6 = ggml_nbytes(local_b8);
    memcpy(pvVar1,&local_c8,sVar6);
  }
  local_e8[0] = '\0';
  local_e8[1] = '\0';
  local_e8[2] = '\0';
  local_e8[3] = '@';
  local_e8[4] = '\0';
  local_e8[5] = '\0';
  local_e8[6] = -0x80;
  local_e8[7] = '?';
  local_e8[8] = '\0';
  local_e8[9] = '\0';
  local_e8[10] = '\0';
  local_e8[0xb] = '@';
  local_e8[0xc] = '\0';
  local_e8[0xd] = '\0';
  local_e8[0xe] = '@';
  local_e8[0xf] = '@';
  local_e8[0x10] = '\0';
  local_e8[0x11] = '\0';
  local_e8[0x12] = -0x80;
  local_e8[0x13] = '@';
  local_e8[0x14] = '\0';
  local_e8[0x15] = '\0';
  local_e8[0x16] = '@';
  local_e8[0x17] = '@';
  local_f0 = (char  [8])ggml_pad_reflect_1d(local_38,local_b8,1);
  local_118 = 0x4000000040400000;
  local_110 = (void *)0x400000003f800000;
  local_108[0] = '\0';
  local_108[1] = '\0';
  local_108[2] = '@';
  local_108[3] = '@';
  local_108[4] = '\0';
  local_108[5] = '\0';
  local_108[6] = -0x80;
  local_108[7] = '@';
  local_108[8] = '\0';
  local_108[9] = '\0';
  local_108[10] = '@';
  local_108[0xb] = '@';
  local_120 = (ggml_tensor *)ggml_pad_reflect_1d(local_38,local_b8,2,1);
  local_148 = (ggml_tensor *)0x3f80000040000000;
  local_140 = (ggml_tensor *)0x4040000040000000;
  local_138 = (ggml_tensor *)0x4040000040800000;
  local_130 = 0x40000000;
  local_150 = (ggml_tensor *)ggml_pad_reflect_1d(local_38,local_b8,1,2);
  local_158 = (ggml_tensor *)ggml_new_graph(local_38);
  ggml_build_forward_expand(local_158,local_f0);
  ggml_build_forward_expand(local_158,local_120);
  ggml_build_forward_expand(local_158,local_150);
  ggml_gallocr_alloc_graph(local_60,local_158);
  ggml_backend_graph_compute(local_10,local_158);
  ne2 = (int)((ulong)uVar3 >> 0x20);
  check_tensor(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
               in_stack_fffffffffffffd00,ne2);
  check_tensor(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
               in_stack_fffffffffffffd00,ne2);
  check_tensor(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
               in_stack_fffffffffffffd00,ne2);
  ggml_free(local_38);
  ggml_backend_buffer_free(local_30);
  ggml_gallocr_free(local_60);
  local_170 = (ggml_tensor *)0x1000000;
  local_168 = (ggml_tensor *)0x0;
  local_160 = 1;
  local_28._0_4_ = 0x1000000;
  local_28._4_4_ = 0;
  local_20._0_4_ = 0;
  local_20._4_4_ = 0;
  local_18._1_7_ = uStack_15f;
  local_18._0_1_ = 1;
  ggml_log_set(ggml_log_callback_default,0);
  uVar3 = local_18;
  local_188[0] = (int32_t)local_28;
  local_188[1] = local_28._4_4_;
  local_180[0] = (int32_t)local_20;
  local_180[1] = local_20._4_4_;
  local_180[2] = (int32_t)local_18;
  local_180[3] = local_18._4_4_;
  local_38 = ggml_init();
  local_30 = ggml_backend_alloc_buffer(local_10,0x1000000);
  ggml_tallocr_new(local_1a8,local_30);
  local_58._0_4_ = local_1a8[0];
  local_58._4_4_ = local_1a8[1];
  local_50._0_4_ = local_1a0[0];
  local_50._4_4_ = local_1a0[1];
  local_48._0_4_ = local_198[0];
  local_48._4_4_ = local_198[1];
  local_40._0_4_ = local_190[0];
  local_40._4_4_ = local_190[1];
  uVar4 = ggml_backend_get_default_buffer_type(local_10);
  local_60 = ggml_gallocr_new(uVar4);
  local_208._88_8_ = ggml_new_tensor_2d(local_38,0,5,4);
  memcpy(local_208,&DAT_00102090,0x50);
  ggml_tallocr_alloc(&local_58,local_208._88_8_);
  uVar5 = ggml_backend_is_cpu(local_10);
  if ((uVar5 & 1) == 0) {
    in_stack_fffffffffffffd10 = (ggml_tensor *)local_208;
    in_stack_fffffffffffffd08 = (float *)local_208._88_8_;
    uVar4 = ggml_nbytes(local_208._88_8_);
    ggml_backend_tensor_set(in_stack_fffffffffffffd08,in_stack_fffffffffffffd10,0,uVar4);
  }
  else {
    pvVar1 = *(void **)(local_208._88_8_ + 0xf8);
    sVar6 = ggml_nbytes(local_208._88_8_);
    memcpy(pvVar1,local_208,sVar6);
  }
  memcpy(local_2a8,&DAT_001020e0,0xa0);
  uVar4 = ggml_pad_reflect_1d(local_38,local_208._88_8_,3,2);
  uVar7 = ggml_new_graph(local_38);
  ggml_build_forward_expand(uVar7,uVar4);
  ggml_gallocr_alloc_graph(local_60,uVar7);
  ggml_backend_graph_compute(local_10,uVar7);
  check_tensor(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
               in_stack_fffffffffffffd00,SUB84(uVar3,4));
  ggml_free(local_38);
  ggml_gallocr_free(local_60);
  ggml_backend_buffer_free(local_30);
  ggml_backend_free(local_10);
  return;
}

Assistant:

void test_pad_reflect_1d(bool use_gpu) {
    ggml_backend_t backend = NULL;
    struct ggml_init_params params;
    ggml_backend_buffer_t buffer;
    struct ggml_context * ctx;
    struct ggml_tallocr tallocr;
    ggml_gallocr_t gallocr;

    // initialize the backend
#ifdef GGML_USE_CUDA
    if (use_gpu) {
        fprintf(stderr, "%s: using CUDA backend\n", __func__);
        backend = ggml_backend_cuda_init(0);
        if (!backend) {
            fprintf(stderr, "%s: ggml_backend_cuda_init() failed\n", __func__);
        }
    }
#endif

#ifdef GGML_USE_METAL
    if (use_gpu) {
        fprintf(stderr, "%s: using Metal backend\n", __func__);
        backend = ggml_backend_metal_init();
        if (!backend) {
            fprintf(stderr, "%s: ggml_backend_metal_init() failed\n", __func__);
        }
    }
#endif

    if (!backend) {
        fprintf(stderr, "%s: using CPU backend\n", __func__);
        backend = ggml_backend_cpu_init();
    }

    // Test cases for different padding configurations
    {
        params = ggml_init_params{
            /*.mem_size   =*/ 16*1024*1024,
            /*.mem_buffer =*/ nullptr,
            /*.no_alloc.  =*/ true
        };

        ggml_log_set(ggml_log_callback_default, nullptr);

        ctx = ggml_init(params);
        buffer = ggml_backend_alloc_buffer(backend, 16*1024*1024);
        tallocr = ggml_tallocr_new(buffer);
        gallocr = ggml_gallocr_new(ggml_backend_get_default_buffer_type(backend));

        // Create a simple 1D input tensor [1, 2, 3, 4]
        struct ggml_tensor * t = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 4);
        float input_data[] = {1.0f, 2.0f, 3.0f, 4.0f};
        ggml_tallocr_alloc(&tallocr, t);

        // load data to buffer
        if(ggml_backend_is_cpu(backend)) {
            memcpy(t->data, input_data, ggml_nbytes(t));
        } else {
            ggml_backend_tensor_set(t, input_data, 0, ggml_nbytes(t));
        }

        // Test case 1: pad left=1, right=1
        // Expected: [2, 1, 2, 3, 4, 3]
        float expected_1[] = {2.0f, 1.0f, 2.0f, 3.0f, 4.0f, 3.0f};
        struct ggml_tensor * out_1 = ggml_pad_reflect_1d(ctx, t, 1, 1);

        // Test case 2: pad left=2, right=1
        // Expected: [3, 2, 1, 2, 3, 4, 3]
        float expected_2[] = {3.0f, 2.0f, 1.0f, 2.0f, 3.0f, 4.0f, 3.0f};
        struct ggml_tensor * out_2 = ggml_pad_reflect_1d(ctx, t, 2, 1);

        // Test case 3: pad left=1, right=2
        // Expected: [2, 1, 2, 3, 4, 3, 2]
        float expected_3[] = {2.0f, 1.0f, 2.0f, 3.0f, 4.0f, 3.0f, 2.0f};
        struct ggml_tensor * out_3 = ggml_pad_reflect_1d(ctx, t, 1, 2);

        struct ggml_cgraph * gf = ggml_new_graph(ctx);
        ggml_build_forward_expand(gf, out_1);
        ggml_build_forward_expand(gf, out_2);
        ggml_build_forward_expand(gf, out_3);

        ggml_gallocr_alloc_graph(gallocr, gf);

        ggml_backend_graph_compute(backend, gf);

        check_tensor(out_1, expected_1, 6, 1, 1);
        check_tensor(out_2, expected_2, 7, 1, 1);
        check_tensor(out_3, expected_3, 7, 1, 1);

        ggml_free(ctx);
        ggml_backend_buffer_free(buffer);
        ggml_gallocr_free(gallocr);
    }

    {
        params = ggml_init_params{
            /*.mem_size   =*/ 16*1024*1024,
            /*.mem_buffer =*/ nullptr,
            /*.no_alloc.  =*/ true
        };

        ggml_log_set(ggml_log_callback_default, nullptr);

        ctx = ggml_init(params);
        buffer = ggml_backend_alloc_buffer(backend, 16*1024*1024);
        tallocr = ggml_tallocr_new(buffer);
        gallocr = ggml_gallocr_new(ggml_backend_get_default_buffer_type(backend));

        // Create a 2D input tensor (5 columns × 4 rows)
        struct ggml_tensor * t = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 5, 4);
        float input_data[] = {
            1.0f, 2.0f, 3.0f, 4.0f, 5.0f,  // row 1
            6.0f, 7.0f, 8.0f, 9.0f, 10.0f, // row 2
            11.0f, 12.0f, 13.0f, 14.0f, 15.0f, // row 3
            16.0f, 17.0f, 18.0f, 19.0f, 20.0f  // row 4
        };
        ggml_tallocr_alloc(&tallocr, t);

        // load data to buffer
        if(ggml_backend_is_cpu(backend)) {
            memcpy(t->data, input_data, ggml_nbytes(t));
        } else {
            ggml_backend_tensor_set(t, input_data, 0, ggml_nbytes(t));
        }

        // Test case 4: pad left=3, right=2 on a 2D tensor
        // Each row should be padded independently
        float expected_4[] = {
            4.0f, 3.0f, 2.0f, 1.0f, 2.0f, 3.0f, 4.0f, 5.0f, 4.0f, 3.0f,  // row 1
            9.0f, 8.0f, 7.0f, 6.0f, 7.0f, 8.0f, 9.0f, 10.0f, 9.0f, 8.0f, // row 2
            14.0f, 13.0f, 12.0f, 11.0f, 12.0f, 13.0f, 14.0f, 15.0f, 14.0f, 13.0f, // row 3
            19.0f, 18.0f, 17.0f, 16.0f, 17.0f, 18.0f, 19.0f, 20.0f, 19.0f, 18.0f  // row 4
        };
        struct ggml_tensor * out_4 = ggml_pad_reflect_1d(ctx, t, 3, 2);

        struct ggml_cgraph * gf = ggml_new_graph(ctx);
        ggml_build_forward_expand(gf, out_4);

        ggml_gallocr_alloc_graph(gallocr, gf);

        ggml_backend_graph_compute(backend, gf);

        check_tensor(out_4, expected_4, 10, 4, 1);

        ggml_free(ctx);
        ggml_gallocr_free(gallocr);
        ggml_backend_buffer_free(buffer);
    }

    ggml_backend_free(backend);
}